

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::chooseColumn(HEkkPrimal *this,bool hyper_sparse)

{
  value_type vVar1;
  char cVar2;
  vector<signed_char,_std::allocator<signed_char>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  HighsInt *pHVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  byte in_SIL;
  HEkkPrimal *in_RDI;
  double dVar10;
  double dVar11;
  double dual_infeasibility_3;
  HighsInt iCol_3;
  double dual_infeasibility_2;
  HighsInt iCol_2;
  HighsInt ix_1;
  vector<int,_std::allocator<int>_> *nonbasic_free_col_set_entry_1;
  double measure_1;
  double dual_infeasibility_1;
  HighsInt iCol_1;
  double measure;
  double dual_infeasibility;
  HighsInt iCol;
  HighsInt ix;
  vector<int,_std::allocator<int>_> *nonbasic_free_col_set_entry;
  HighsInt *num_nonbasic_free_col;
  bool local_use_hyper_chuzc;
  double best_measure;
  vector<double,_std::allocator<double>_> *workDual;
  vector<signed_char,_std::allocator<signed_char>_> *nonbasicMove;
  double in_stack_ffffffffffffff18;
  HighsSimplexAnalysis *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int iVar12;
  HighsInt in_stack_ffffffffffffff84;
  int iVar13;
  undefined8 in_stack_ffffffffffffff88;
  HighsInt *in_stack_ffffffffffffff90;
  int local_5c;
  int local_44;
  double local_28;
  
  this_00 = &(in_RDI->ekk_instance_->basis_).nonbasicMove_;
  this_01 = &(in_RDI->ekk_instance_->info_).workDual_;
  local_28 = 0.0;
  in_RDI->variable_in = -1;
  pHVar3 = HSet::count(&in_RDI->nonbasic_free_col_set);
  if ((in_SIL & 1) == 0) {
    HighsSimplexAnalysis::simplexTimerStart
              (in_stack_ffffffffffffff20,(HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               SUB84(in_stack_ffffffffffffff18,0));
    if (*pHVar3 != 0) {
      pvVar4 = HSet::entry(&in_RDI->nonbasic_free_col_set);
      for (iVar13 = 0; iVar13 < *pHVar3; iVar13 = iVar13 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar13);
        iVar12 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar12);
        dVar10 = ABS(*pvVar6);
        if ((in_RDI->dual_feasibility_tolerance <= dVar10 &&
             dVar10 != in_RDI->dual_feasibility_tolerance) &&
           (dVar11 = dVar10 * dVar10,
           pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&in_RDI->edge_weight_,(long)iVar12), local_28 * *pvVar8 < dVar11)) {
          in_RDI->variable_in = iVar12;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->edge_weight_,(long)iVar12);
          local_28 = (dVar10 * dVar10) / *pvVar8;
        }
      }
    }
    for (iVar13 = 0; iVar13 < in_RDI->num_tot; iVar13 = iVar13 + 1) {
      pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (this_00,(long)iVar13);
      cVar2 = *pvVar7;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar13);
      dVar10 = (double)-(int)cVar2 * *pvVar6;
      if (in_RDI->dual_feasibility_tolerance <= dVar10 &&
          dVar10 != in_RDI->dual_feasibility_tolerance) {
        in_stack_ffffffffffffff20 = (HighsSimplexAnalysis *)(dVar10 * dVar10);
        in_stack_ffffffffffffff18 = local_28;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->edge_weight_,(long)iVar13);
        if (in_stack_ffffffffffffff18 * *pvVar8 < (double)in_stack_ffffffffffffff20) {
          in_RDI->variable_in = iVar13;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->edge_weight_,(long)iVar13);
          local_28 = (dVar10 * dVar10) / *pvVar8;
        }
      }
    }
    HighsSimplexAnalysis::simplexTimerStop
              (in_stack_ffffffffffffff20,(HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               SUB84(in_stack_ffffffffffffff18,0));
  }
  else {
    if ((in_RDI->initialise_hyper_chuzc & 1U) == 0) {
      hyperChooseColumn(in_RDI);
    }
    if ((in_RDI->initialise_hyper_chuzc & 1U) != 0) {
      HighsSimplexAnalysis::simplexTimerStart
                (in_stack_ffffffffffffff20,(HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 SUB84(in_stack_ffffffffffffff18,0));
      in_RDI->num_hyper_chuzc_candidates = 0;
      if (*pHVar3 != 0) {
        pvVar4 = HSet::entry(&in_RDI->nonbasic_free_col_set);
        for (local_44 = 0; local_44 < *pHVar3; local_44 = local_44 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_44);
          iVar13 = *pvVar5;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar13);
          if (in_RDI->dual_feasibility_tolerance <= ABS(*pvVar6) &&
              ABS(*pvVar6) != in_RDI->dual_feasibility_tolerance) {
            std::vector<double,_std::allocator<double>_>::operator[]
                      (&in_RDI->edge_weight_,(long)iVar13);
            addToDecreasingHeap(in_stack_ffffffffffffff90,
                                (HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                                (vector<double,_std::allocator<double>_> *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff78,
                                (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                ),
                                (HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          }
        }
      }
      for (local_5c = 0; local_5c < in_RDI->num_tot; local_5c = local_5c + 1) {
        pvVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (this_00,(long)local_5c);
        cVar2 = *pvVar7;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)local_5c);
        dVar10 = (double)-(int)cVar2 * *pvVar6;
        if (in_RDI->dual_feasibility_tolerance <= dVar10 &&
            dVar10 != in_RDI->dual_feasibility_tolerance) {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->edge_weight_,(long)local_5c);
          addToDecreasingHeap((HighsInt *)((dVar10 * dVar10) / *pvVar8),
                              (HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                              (vector<double,_std::allocator<double>_> *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff78,
                              (double)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20));
        }
      }
      sortDecreasingHeap(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                         (vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      in_RDI->initialise_hyper_chuzc = false;
      HighsSimplexAnalysis::simplexTimerStop
                (in_stack_ffffffffffffff20,(HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 SUB84(in_stack_ffffffffffffff18,0));
      if (in_RDI->num_hyper_chuzc_candidates != 0) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->hyper_chuzc_candidate,1);
        in_RDI->variable_in = *pvVar9;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->hyper_chuzc_measure,1);
        vVar1 = *pvVar8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->hyper_chuzc_measure,(long)in_RDI->num_hyper_chuzc_candidates);
        in_RDI->max_hyper_chuzc_non_candidate_measure = *pvVar8;
        if ((in_RDI->report_hyper_chuzc & 1U) != 0) {
          printf("Full CHUZC: Max         measure is %9.4g for column %4d, and max non-candidate measure of  %9.4g\n"
                 ,vVar1,SUB84(in_RDI->max_hyper_chuzc_non_candidate_measure,0),
                 (ulong)(uint)in_RDI->variable_in);
        }
      }
    }
  }
  return;
}

Assistant:

void HEkkPrimal::chooseColumn(const bool hyper_sparse) {
  assert(!hyper_sparse || !done_next_chuzc);
  const vector<int8_t>& nonbasicMove = ekk_instance_.basis_.nonbasicMove_;
  const vector<double>& workDual = ekk_instance_.info_.workDual_;
  double best_measure = 0;
  variable_in = -1;

  const bool local_use_hyper_chuzc = hyper_sparse;
  // Consider nonbasic free columns first
  const HighsInt& num_nonbasic_free_col = nonbasic_free_col_set.count();
  if (local_use_hyper_chuzc) {
    if (!initialise_hyper_chuzc) hyperChooseColumn();
    if (initialise_hyper_chuzc) {
      analysis->simplexTimerStart(ChuzcHyperInitialiselClock);
      num_hyper_chuzc_candidates = 0;
      if (num_nonbasic_free_col) {
        const vector<HighsInt>& nonbasic_free_col_set_entry =
            nonbasic_free_col_set.entry();
        for (HighsInt ix = 0; ix < num_nonbasic_free_col; ix++) {
          HighsInt iCol = nonbasic_free_col_set_entry[ix];
          double dual_infeasibility = fabs(workDual[iCol]);
          if (dual_infeasibility > dual_feasibility_tolerance) {
            double measure =
                dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
            addToDecreasingHeap(
                num_hyper_chuzc_candidates, max_num_hyper_chuzc_candidates,
                hyper_chuzc_measure, hyper_chuzc_candidate, measure, iCol);
          }
        }
      }
      // Now look at other columns
      for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
        double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
        if (dual_infeasibility > dual_feasibility_tolerance) {
          double measure =
              dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
          addToDecreasingHeap(
              num_hyper_chuzc_candidates, max_num_hyper_chuzc_candidates,
              hyper_chuzc_measure, hyper_chuzc_candidate, measure, iCol);
        }
      }
      // Sort the heap
      sortDecreasingHeap(num_hyper_chuzc_candidates, hyper_chuzc_measure,
                         hyper_chuzc_candidate);
      initialise_hyper_chuzc = false;
      analysis->simplexTimerStop(ChuzcHyperInitialiselClock);
      // Choose the first entry - if there is one
      if (num_hyper_chuzc_candidates) {
        variable_in = hyper_chuzc_candidate[1];
        best_measure = hyper_chuzc_measure[1];
        max_hyper_chuzc_non_candidate_measure =
            hyper_chuzc_measure[num_hyper_chuzc_candidates];
        if (report_hyper_chuzc)
          printf(
              "Full CHUZC: Max         measure is %9.4g for column "
              "%4" HIGHSINT_FORMAT
              ", and "
              "max non-candidate measure of  %9.4g\n",
              best_measure, variable_in, max_hyper_chuzc_non_candidate_measure);
      }
    }
  } else {
    analysis->simplexTimerStart(ChuzcPrimalClock);
    // Choose any attractive nonbasic free column
    if (num_nonbasic_free_col) {
      const vector<HighsInt>& nonbasic_free_col_set_entry =
          nonbasic_free_col_set.entry();
      for (HighsInt ix = 0; ix < num_nonbasic_free_col; ix++) {
        HighsInt iCol = nonbasic_free_col_set_entry[ix];
        double dual_infeasibility = fabs(workDual[iCol]);
        if (dual_infeasibility > dual_feasibility_tolerance &&
            dual_infeasibility * dual_infeasibility >
                best_measure * edge_weight_[iCol]) {
          variable_in = iCol;
          best_measure =
              dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
        }
      }
    }
    // Now look at other columns
    for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
      double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
      if (dual_infeasibility > dual_feasibility_tolerance &&
          dual_infeasibility * dual_infeasibility >
              best_measure * edge_weight_[iCol]) {
        variable_in = iCol;
        best_measure =
            dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
      }
    }
    analysis->simplexTimerStop(ChuzcPrimalClock);
  }
  //  printf("ChooseColumn: Iteration %" HIGHSINT_FORMAT ", choose column %"
  //  HIGHSINT_FORMAT " with measure %g\n",
  //	 ekk_instance_.iteration_count_, variable_in, best_measure);
}